

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_return_stmt(SyntaxAnalyze *this)

{
  pointer pWVar1;
  int *piVar2;
  bool bVar3;
  ulong uVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> retStr;
  string tmpName;
  anon_class_1_0_00000001 local_109;
  long *local_108;
  long local_100;
  long local_f8 [2];
  char local_e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e0;
  bool local_c0;
  string local_b8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  byte local_78;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  byte local_50;
  RightVal local_48;
  
  local_e8 = '\0';
  match_one_word(this,RETURNTK);
  uVar4 = this->matched_index + 1;
  pWVar1 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)(((long)(this->word_list->
                             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                     -0x5555555555555555)) {
    bVar3 = word::Word::match_token(pWVar1 + uVar4,SEMICN);
    if (bVar3) goto LAB_001a8c94;
  }
  gm_exp((SyntaxAnalyze *)&local_70._M_first);
  piVar2 = (int *)CONCAT44(local_70._4_4_,local_70._M_first._M_storage);
  if (*piVar2 == 0) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_b8,&this->irGenerator,Int);
    local_70._M_first._M_storage = (_Uninitialized<int,_true>)piVar2[2];
    local_50 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_70._M_first);
    local_98._0_8_ = (long)&local_98 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    local_78 = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_48,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_70._M_first);
    irGenerator::irGenerator::ir_assign(&this->irGenerator,(LeftVal *)&local_98._M_first,&local_48);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_48.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              (&local_109,&local_48);
    local_48.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_78]._M_data)
              (&local_109,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_98._M_first);
    local_78 = 0xff;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_108,&local_b8);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_50]._M_data)
              (&local_109,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_70._M_first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(piVar2 + 4));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
LAB_001a8c94:
  match_one_word(this,SEMICN);
  local_c0 = false;
  bVar3 = local_e8 == '\x01';
  if (bVar3) {
    local_e0._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_e0._M_value + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_108,local_100 + (long)local_108);
  }
  local_c0 = bVar3;
  irGenerator::irGenerator::ir_jump
            (&this->irGenerator,Return,-1,-1,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e0,Undefined);
  if (local_c0 == true) {
    local_c0 = false;
    if (local_e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e0._M_value + 0x10)) {
      operator_delete((void *)local_e0._M_value._M_dataplus._M_p,local_e0._16_8_ + 1);
    }
  }
  if (local_e8 == '\x01') {
    local_e8 = 0;
    if (local_108 != local_f8) {
      operator_delete(local_108,local_f8[0] + 1);
    }
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_return_stmt() {
  std::optional<string> retStr;

  match_one_word(Token::RETURNTK);
  if (!try_word(1, Token::SEMICN)) {
    SharedExNdPtr retValue;

    retValue = gm_exp();

    if (retValue->_type == NodeType::CNS) {
      string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      RightVal right;
      right.emplace<0>(retValue->_value);
      irGenerator.ir_assign(tmpName, right);
      retStr = tmpName;
    } else {
      retStr = retValue->_name;
    }
  }
  match_one_word(Token::SEMICN);

  irGenerator.ir_jump(mir::inst::JumpInstructionKind::Return, -1, -1, retStr,
                      mir::inst::JumpKind::Undefined);
}